

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

void __thiscall clipp::parser::add_match(parser *this,match_t *match)

{
  bool bVar1;
  undefined1 uVar2;
  pattern *ppVar3;
  arg_string *paVar4;
  match_t *in_RSI;
  scoped_dfs_traverser *in_RDI;
  arg_mapping newArg;
  scoped_dfs_traverser *pos;
  value_type *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  string *this_00;
  parameter *p;
  parser *this_01;
  string local_138 [16];
  scoped_dfs_traverser *in_stack_fffffffffffffed8;
  parser *in_stack_fffffffffffffee0;
  parser *in_stack_fffffffffffffee8;
  dfs_traverser *in_stack_fffffffffffffef8;
  parser *in_stack_ffffffffffffff00;
  scoped_dfs_traverser *in_stack_ffffffffffffff18;
  parser *in_stack_ffffffffffffff20;
  undefined1 local_b8 [168];
  match_t *local_10;
  
  local_10 = in_RSI;
  local_b8._160_8_ = detail::match_t::pos(in_RSI);
  bVar1 = detail::scoped_dfs_traverser::operator_cast_to_bool((scoped_dfs_traverser *)0x192156);
  if (bVar1) {
    ppVar3 = detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x192169);
    bVar1 = group::child_t<clipp::parameter,_clipp::group>::is_param(ppVar3);
    if (bVar1) {
      p = (parameter *)
          &(in_RDI->pos_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      this_01 = (parser *)local_b8;
      detail::scoped_dfs_traverser::scoped_dfs_traverser(in_RDI,(scoped_dfs_traverser *)this_01);
      detail::scoped_dfs_traverser::next_after_match
                ((scoped_dfs_traverser *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      detail::scoped_dfs_traverser::~scoped_dfs_traverser
                ((scoped_dfs_traverser *)
                 CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      paVar4 = detail::match_t::str_abi_cxx11_(local_10);
      this_00 = local_138;
      std::__cxx11::string::string(this_00,(string *)paVar4);
      detail::scoped_dfs_traverser::base((scoped_dfs_traverser *)local_b8._160_8_);
      arg_mapping::arg_mapping
                ((arg_mapping *)in_RDI,(arg_index)((ulong)this_01 >> 0x20),(arg_string *)p,
                 (dfs_traverser *)this_00);
      std::__cxx11::string::~string(local_138);
      ppVar3 = detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x19222a);
      group::child_t<clipp::parameter,_clipp::group>::as_param(ppVar3);
      occurrences_of(this_01,p);
      detail::scoped_dfs_traverser::base((scoped_dfs_traverser *)local_b8._160_8_);
      uVar2 = check_conflicts(in_stack_fffffffffffffee8,(dfs_traverser *)in_stack_fffffffffffffee0);
      detail::scoped_dfs_traverser::start_of_repeat_group
                ((scoped_dfs_traverser *)
                 &(in_RDI->pos_).stack_.
                  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::
      push_back((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_> *)
                CONCAT17(uVar2,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88);
      add_miss_candidates_after(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      detail::scoped_dfs_traverser::base((scoped_dfs_traverser *)local_b8._160_8_);
      clean_miss_candidates_for(in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->pos_);
      detail::scoped_dfs_traverser::base((scoped_dfs_traverser *)local_b8._160_8_);
      discard_alternative_miss_candidates(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      arg_mapping::~arg_mapping((arg_mapping *)CONCAT17(uVar2,in_stack_fffffffffffffe90));
    }
  }
  return;
}

Assistant:

void add_match(const match_t& match)
    {
        const auto& pos = match.pos();
        if(!pos || !pos->is_param()) return;

        pos_.next_after_match(pos);

        arg_mapping newArg{index_, match.str(), pos.base()};
        newArg.repeat_ = occurrences_of(&pos->as_param());
        newArg.conflict_ = check_conflicts(pos.base());
        newArg.startsRepeatGroup_ = pos_.start_of_repeat_group();
        args_.push_back(std::move(newArg));

        add_miss_candidates_after(pos);
        clean_miss_candidates_for(pos.base());
        discard_alternative_miss_candidates(pos.base());

    }